

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

int GetFPS(void)

{
  float fVar1;
  double dVar2;
  int iVar3;
  float fVar4;
  
  fVar4 = (float)CORE.Time.frame;
  if (CORE.Time.frameCounter == 0) {
    GetFPS::average = 0.0;
    GetFPS::last = 0.0;
    GetFPS::index = 0;
    GetFPS::history[0] = 0.0;
    GetFPS::history[1] = 0.0;
    GetFPS::history[2] = 0.0;
    GetFPS::history[3] = 0.0;
    GetFPS::history[4] = 0.0;
    GetFPS::history[5] = 0.0;
    GetFPS::history[6] = 0.0;
    GetFPS::history[7] = 0.0;
    GetFPS::history[8] = 0.0;
    GetFPS::history[9] = 0.0;
    GetFPS::history[10] = 0.0;
    GetFPS::history[0xb] = 0.0;
    GetFPS::history[0xc] = 0.0;
    GetFPS::history[0xd] = 0.0;
    GetFPS::history[0xe] = 0.0;
    GetFPS::history[0xf] = 0.0;
    GetFPS::history[0x10] = 0.0;
    GetFPS::history[0x11] = 0.0;
    GetFPS::history[0x12] = 0.0;
    GetFPS::history[0x13] = 0.0;
    GetFPS::history[0x14] = 0.0;
    GetFPS::history[0x15] = 0.0;
    GetFPS::history[0x16] = 0.0;
    GetFPS::history[0x17] = 0.0;
    GetFPS::history[0x18] = 0.0;
    GetFPS::history[0x19] = 0.0;
    GetFPS::history[0x1a] = 0.0;
    GetFPS::history[0x1b] = 0.0;
    GetFPS::history[0x1c] = 0.0;
    GetFPS::history[0x1d] = 0.0;
  }
  if ((fVar4 == 0.0) && (!NAN(fVar4))) {
    return 0;
  }
  dVar2 = glfwGetTime();
  if (0.01666666753590107 < dVar2 - (double)GetFPS::last) {
    dVar2 = glfwGetTime();
    GetFPS::last = (float)dVar2;
    iVar3 = (int)((ulong)((long)(GetFPS::index + 1) * -0x77777777) >> 0x20) + GetFPS::index + 1;
    GetFPS::index = GetFPS::index + ((iVar3 >> 4) - (iVar3 >> 0x1f)) * -0x1e + 1;
    fVar1 = GetFPS::history[GetFPS::index];
    GetFPS::history[GetFPS::index] = fVar4 / 30.0;
    GetFPS::average = fVar4 / 30.0 + (GetFPS::average - fVar1);
  }
  fVar4 = roundf(1.0 / GetFPS::average);
  return (int)fVar4;
}

Assistant:

int GetFPS(void)
{
    int fps = 0;

#if !defined(SUPPORT_CUSTOM_FRAME_CONTROL)
    #define FPS_CAPTURE_FRAMES_COUNT    30      // 30 captures
    #define FPS_AVERAGE_TIME_SECONDS   0.5f     // 500 milliseconds
    #define FPS_STEP (FPS_AVERAGE_TIME_SECONDS/FPS_CAPTURE_FRAMES_COUNT)

    static int index = 0;
    static float history[FPS_CAPTURE_FRAMES_COUNT] = { 0 };
    static float average = 0, last = 0;
    float fpsFrame = GetFrameTime();

    // if we reset the window, reset the FPS info
    if (CORE.Time.frameCounter == 0)
    {
        average = 0;
        last = 0;
        index = 0;

        for (int i = 0; i < FPS_CAPTURE_FRAMES_COUNT; i++) history[i] = 0;
    }

    if (fpsFrame == 0) return 0;

    if ((GetTime() - last) > FPS_STEP)
    {
        last = (float)GetTime();
        index = (index + 1)%FPS_CAPTURE_FRAMES_COUNT;
        average -= history[index];
        history[index] = fpsFrame/FPS_CAPTURE_FRAMES_COUNT;
        average += history[index];
    }

    fps = (int)roundf(1.0f/average);
#endif

    return fps;
}